

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness
          (DescriptorBuilder *this,string_view message_name,DescriptorProto *message,
          Descriptor *descriptor,bool use_custom_names)

{
  char *pcVar1;
  ulong *puVar2;
  size_t size;
  size_t __n;
  _Alloc_hider *__n_00;
  uint uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  undefined8 uVar6;
  undefined8 uVar7;
  DescriptorProto *pDVar8;
  char cVar9;
  ushort uVar10;
  int iVar11;
  Rep *pRVar12;
  size_t *psVar13;
  MixingHashState MVar14;
  long lVar15;
  undefined8 *puVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined1 uVar19;
  uint uVar20;
  uint64_t v;
  DescriptorProto *pDVar21;
  DescriptorProto *pDVar22;
  MaybeInitializedPtr MVar23;
  undefined3 in_register_00000089;
  ulong uVar24;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  long *plVar25;
  undefined8 uVar26;
  ulong uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  string_view input;
  FindInfo FVar34;
  JsonNameDetails details;
  anon_class_24_3_4f82d86e make_error;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  name_to_field;
  __m128i match;
  _Alloc_hider local_188;
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160;
  undefined1 local_158 [64];
  undefined1 local_118 [16];
  HeapOrSoo local_108 [2];
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 local_b8 [16];
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  Descriptor *local_90;
  void **local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  VoidPtr local_60;
  code *pcStack_58;
  VoidPtr local_50;
  code *pcStack_48;
  VoidPtr local_40;
  code *pcStack_38;
  
  local_158._60_4_ = CONCAT31(in_register_00000089,use_custom_names);
  local_e8 = message_name._M_str;
  local_108[1]._8_8_ = message_name._M_len;
  local_118 = (undefined1  [16])0x0;
  local_e0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_108[0].heap.control =
       absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  this_00 = &(message->field_0)._impl_.field_;
  pDVar22 = message;
  uVar28 = this_00;
  local_108[1]._0_8_ = this;
  local_90 = descriptor;
  if ((undefined1  [216])((undefined1  [216])message->field_0 & (undefined1  [216])0x1) !=
      (undefined1  [216])0x0) {
    pRVar12 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    uVar28 = pRVar12->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar12 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar12->elements;
    }
  }
  local_88 = &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
             *(int *)((long)&message->field_0 + 0x10);
  if ((void **)uVar28 == local_88) {
LAB_001f5167:
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                     *)local_118);
    return;
  }
LAB_001f48c0:
  uVar18 = (((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)uVar28)->
           super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
  psVar13 = (size_t *)
            ((ulong)(((DescriptorProto *)uVar18)->field_0)._impl_.field_.super_RepeatedPtrFieldBase.
                    tagged_rep_or_elem_ & 0xfffffffffffffffc);
  input._M_str = (char *)pDVar22;
  input._M_len = *psVar13;
  (anonymous_namespace)::ToJsonName_abi_cxx11_
            ((string *)local_158,(_anonymous_namespace_ *)psVar13[1],input);
  if ((local_158[0x3c] == '\0') ||
     ((undefined1  [216])
      ((undefined1  [216])((DescriptorProto *)uVar18)->field_0 & (undefined1  [216])0x10) ==
      (undefined1  [216])0x0)) {
LAB_001f48f0:
    if ((DescriptorProto *)local_158._0_8_ == (DescriptorProto *)(local_158 + 0x10)) {
      local_170._8_8_ = local_158._24_8_;
      local_180._0_8_ = local_180 + 0x10;
    }
    else {
      local_180._0_8_ = local_158._0_8_;
    }
    local_170._M_allocated_capacity = local_158._16_8_;
    local_180._8_8_ = local_158._8_8_;
    local_160 = 0;
    local_188._M_p = (pointer)uVar18;
LAB_001f4930:
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
    ::AssertHashEqConsistent<std::__cxx11::string>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                *)local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    uVar26 = local_180._8_8_;
    MVar14 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                       ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                        (uchar *)local_180._0_8_,local_180._8_8_);
    uVar7 = local_108[0].heap.slot_array;
    uVar6 = local_180._8_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = MVar14.state_ + uVar26;
    uVar26 = local_118._0_8_;
    local_158._32_8_ = uVar18;
    if (((ulong)((long)&((ThreadSafeArena *)local_118._0_8_)->tag_and_id_ + 1U) & local_118._0_8_)
        == 0) {
      _local_a8 = SUB168(auVar29 * ZEXT816(0x9ddfea08eb382d69),8) ^
                  SUB168(auVar29 * ZEXT816(0x9ddfea08eb382d69),0);
      uVar27 = (ulong)_local_a8 >> 7 ^ (ulong)local_108[0]._0_8_ >> 0xc;
      auVar29 = ZEXT216(CONCAT11((char)_local_a8,(char)_local_a8) & 0x7f7f);
      auVar29 = pshuflw(auVar29,auVar29,0);
      local_b8._0_4_ = auVar29._0_4_;
      local_b8._4_4_ = local_b8._0_4_;
      local_b8._8_4_ = local_b8._0_4_;
      local_b8._12_4_ = local_b8._0_4_;
      local_d0 = local_180._0_8_;
      local_158._40_8_ = (DescriptorProto *)0x0;
      local_158._48_8_ = local_108[0].heap.control;
      local_d8 = uVar28;
      do {
        uVar27 = uVar27 & uVar26;
        pcVar1 = (char *)(local_158._48_8_ + uVar27);
        uStack_c0 = pcVar1[8];
        uStack_bf = pcVar1[9];
        uStack_be = pcVar1[10];
        uStack_bd = pcVar1[0xb];
        uStack_bc = pcVar1[0xc];
        uStack_bb = pcVar1[0xd];
        uStack_ba = pcVar1[0xe];
        uStack_b9 = pcVar1[0xf];
        auVar30[0] = -(local_b8[0] == *pcVar1);
        auVar30[1] = -(local_b8[1] == pcVar1[1]);
        auVar30[2] = -(local_b8[2] == pcVar1[2]);
        auVar30[3] = -(local_b8[3] == pcVar1[3]);
        auVar30[4] = -(local_b8[4] == pcVar1[4]);
        auVar30[5] = -(local_b8[5] == pcVar1[5]);
        auVar30[6] = -(local_b8[6] == pcVar1[6]);
        auVar30[7] = -(local_b8[7] == pcVar1[7]);
        auVar30[8] = -(local_b8[8] == uStack_c0);
        auVar30[9] = -(local_b8[9] == uStack_bf);
        auVar30[10] = -(local_b8[10] == uStack_be);
        auVar30[0xb] = -(local_b8[0xb] == uStack_bd);
        auVar30[0xc] = -(local_b8[0xc] == uStack_bc);
        auVar30[0xd] = -(local_b8[0xd] == uStack_bb);
        auVar30[0xe] = -(local_b8[0xe] == uStack_ba);
        auVar30[0xf] = -(local_b8[0xf] == uStack_b9);
        uVar10 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf
        ;
        uVar20 = (uint)uVar10;
        pDVar22 = (DescriptorProto *)local_158._48_8_;
        uVar28 = _local_a8;
        uVar18 = *(DescriptorProto **)pcVar1;
        while (_local_c8 = uVar18, _local_a8 = uVar28, uVar10 != 0) {
          uVar3 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar24 = uVar3 + uVar27 & uVar26;
          if (((_Alloc_hider *)((InternalMetadata *)(uVar7 + 8))[uVar24 * 10].ptr_ ==
               (_Alloc_hider *)uVar6) &&
             (((_Alloc_hider *)uVar6 == (_Alloc_hider *)0x0 ||
              (iVar11 = bcmp(*(void **)(uVar7 + uVar24 * 0x50),(void *)local_d0,uVar6), iVar11 == 0)
              ))) {
            if ((DescriptorProto *)local_158._48_8_ == (DescriptorProto *)0x0) goto LAB_001f520a;
            pDVar21 = (DescriptorProto *)(local_158._48_8_ + uVar24);
            if (pDVar21 == (DescriptorProto *)local_e0) goto LAB_001f518b;
            if (*(char *)&(pDVar21->super_Message).super_MessageLite._vptr_MessageLite < '\0')
            goto LAB_001f51bb;
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
            ::iterator::operator*((iterator *)pDVar21);
            uVar28 = local_d8;
            puVar16 = (undefined8 *)(uVar7 + uVar24 * 0x50);
            uVar18 = CONCAT71((int7)((ulong)pDVar22 >> 8),local_160);
            if (local_158[0x3c] == '\0') {
              if ((local_160 & 1) == 0) goto LAB_001f4fbc;
LAB_001f4f97:
              cVar9 = *(char *)(puVar16 + 9);
            }
            else {
              if ((local_160 & 1) != 0) goto LAB_001f4f97;
              if (*(char *)(puVar16 + 9) != '\x01') goto LAB_001f50b1;
LAB_001f4fbc:
              cVar9 = '\0';
            }
            local_158._0_8_ = &local_188;
            local_158._16_8_ = local_158._32_8_;
            uVar18 = local_158._32_8_;
            local_158._8_8_ = (_Alloc_hider *)(puVar16 + 4);
            if (((local_90->merged_features_->field_0)._impl_.json_format_ == 2) && (cVar9 == '\0'))
            {
              pcStack_48 = absl::lts_20240722::functional_internal::
                           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              local_50.obj = local_158;
              element_name._M_str = (char *)local_e8;
              element_name._M_len = local_108[1]._8_8_;
              make_error_00.invoker_ =
                   absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              make_error_00.ptr_.obj = local_50.obj;
              AddWarning((DescriptorBuilder *)local_108[1]._0_8_,element_name,
                         (Message *)local_158._32_8_,NAME,make_error_00);
            }
            else {
              pcStack_58 = absl::lts_20240722::functional_internal::
                           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              local_60.obj = local_158;
              element_name_00._M_str = (char *)local_e8;
              element_name_00._M_len = local_108[1]._8_8_;
              make_error_01.invoker_ =
                   absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
              ;
              make_error_01.ptr_.obj = local_60.obj;
              AddError((DescriptorBuilder *)local_108[1]._0_8_,element_name_00,
                       (Message *)local_158._32_8_,NAME,make_error_01);
            }
            goto LAB_001f50b1;
          }
          uVar10 = (ushort)(uVar20 - 1) & (ushort)uVar20;
          uVar20 = CONCAT22((short)(uVar20 - 1 >> 0x10),uVar10);
          uVar28 = _local_a8;
          uVar18 = _local_c8;
        }
        local_c8 = (undefined1)uVar18;
        uStack_c7 = (undefined1)((ulong)uVar18 >> 8);
        uStack_c6 = (undefined1)((ulong)uVar18 >> 0x10);
        uStack_c5 = (undefined1)((ulong)uVar18 >> 0x18);
        uStack_c4 = (undefined1)((ulong)uVar18 >> 0x20);
        uStack_c3 = (undefined1)((ulong)uVar18 >> 0x28);
        uStack_c2 = (undefined1)((ulong)uVar18 >> 0x30);
        uStack_c1 = (undefined1)((ulong)uVar18 >> 0x38);
        auVar31[0] = -(local_c8 == -0x80);
        auVar31[1] = -(uStack_c7 == -0x80);
        auVar31[2] = -(uStack_c6 == -0x80);
        auVar31[3] = -(uStack_c5 == -0x80);
        auVar31[4] = -(uStack_c4 == -0x80);
        auVar31[5] = -(uStack_c3 == -0x80);
        auVar31[6] = -(uStack_c2 == -0x80);
        auVar31[7] = -(uStack_c1 == -0x80);
        auVar31[8] = -(uStack_c0 == -0x80);
        auVar31[9] = -(uStack_bf == -0x80);
        auVar31[10] = -(uStack_be == -0x80);
        auVar31[0xb] = -(uStack_bd == -0x80);
        auVar31[0xc] = -(uStack_bc == -0x80);
        auVar31[0xd] = -(uStack_bb == -0x80);
        auVar31[0xe] = -(uStack_ba == -0x80);
        auVar31[0xf] = -(uStack_b9 == -0x80);
        uVar10 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf
        ;
        if (uVar10 != 0) goto LAB_001f4ace;
        uVar27 = local_158._40_8_ + uVar27 + 0x10;
        local_158._40_8_ = local_158._40_8_ + 0x10;
      } while ((ulong)local_158._40_8_ <= (ulong)uVar26);
      goto LAB_001f5297;
    }
    goto LAB_001f51eb;
  }
  uVar27._0_4_ = *(int *)((long)&((DescriptorProto *)uVar18)->field_0 + 0x28);
  uVar27._4_4_ = *(int *)((long)&((DescriptorProto *)uVar18)->field_0 + 0x2c);
  plVar25 = (long *)(uVar27 & 0xfffffffffffffffc);
  __n_00 = (_Alloc_hider *)plVar25[1];
  if ((__n_00 == (_Alloc_hider *)local_158._8_8_) &&
     ((__n_00 == (_Alloc_hider *)0x0 ||
      (iVar11 = bcmp((void *)*plVar25,(void *)local_158._0_8_,(size_t)__n_00), iVar11 == 0))))
  goto LAB_001f48f0;
  local_188._M_p = (pointer)uVar18;
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,*plVar25,(long)&__n_00->_M_p + *plVar25);
  local_160 = 1;
  if (((DescriptorProto *)local_158._0_8_ != (DescriptorProto *)(local_158 + 0x10)) &&
     (operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1)), (local_160 & 1) == 0))
  goto LAB_001f4930;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_180._0_8_,(pointer)(local_180._0_8_ + local_180._8_8_));
  if ((local_78 == 0) || ((char)*local_80 != '[')) {
    bVar17 = false;
  }
  else {
    bVar17 = ((char *)((long)local_80 + -1))[local_78] == ']';
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (!bVar17) goto LAB_001f4930;
  local_158._8_8_ = &local_188;
  pcStack_38 = absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
  ;
  local_40.obj = local_158;
  element_name_01._M_str = (char *)local_e8;
  element_name_01._M_len = local_108[1]._8_8_;
  make_error_02.invoker_ =
       absl::lts_20240722::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
  ;
  make_error_02.ptr_.obj = local_40.obj;
  local_158._0_8_ = uVar18;
  AddError((DescriptorBuilder *)local_108[1]._0_8_,element_name_01,(Message *)uVar18,NAME,
           make_error_02);
  goto LAB_001f50b1;
LAB_001f4ace:
  cVar9 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                    (uVar26,uVar28,(ctrl_t *)local_158._48_8_);
  if (cVar9 == '\0') {
    uVar20 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
    }
  }
  else {
    uVar4 = 0xf;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar20 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
  }
  FVar34.offset = uVar20 + uVar27 & uVar26;
  FVar34.probe_length = local_158._40_8_;
  lVar15 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                     ((CommonFields *)local_118,uVar28,FVar34,
                      (PolicyFunctions *)
                      absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                      ::GetPolicyFunctions()::value);
  uVar28 = local_108[0].heap.control;
  if ((DescriptorProto *)local_108[0]._0_8_ == (DescriptorProto *)0x0) {
LAB_001f520a:
    __assert_fail("ctrl != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x9c4,
                  "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                 );
  }
  MVar23.p = (void *)(local_108[0].heap.slot_array.p + lVar15 * 0x50);
  puVar16 = (undefined8 *)(local_108[0].heap.slot_array.p + lVar15 * 0x50);
  *puVar16 = puVar16 + 2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)MVar23.p,local_180._0_8_,(pointer)(local_180._0_8_ + local_180._8_8_));
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)MVar23.p + 0x20))->
  _M_dataplus)._M_p = local_188._M_p;
  *(undefined1 **)((long)MVar23.p + 0x28) = (undefined1 *)((long)MVar23.p + 0x38);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)MVar23.p + 0x28),local_180._0_8_,
             (pointer)(local_180._0_8_ + local_180._8_8_));
  *(undefined1 *)((long)MVar23.p + 0x48) = local_160;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  ::iterator::operator*((iterator *)(uVar28 + lVar15));
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
  ::AssertHashEqConsistent<std::__cxx11::string>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
              *)local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)MVar23.p);
  size = ((InternalMetadata *)((long)MVar23.p + 8))->ptr_;
  MVar14 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                      *MVar23.p,size);
  uVar26 = local_108[0].heap.slot_array;
  uVar6 = local_118._0_8_;
  if (((ulong)((long)&((ThreadSafeArena *)local_118._0_8_)->tag_and_id_ + 1U) & local_118._0_8_) ==
      0) {
    uVar18 = (DescriptorProto *)0x9ddfea08eb382d69;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = MVar14.state_ + size;
    uVar27 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar24 = uVar27 >> 7 ^ (ulong)local_108[0]._0_8_ >> 0xc;
    uVar19 = (undefined1)uVar27;
    auVar29 = ZEXT216(CONCAT11(uVar19,uVar19) & 0x7f7f);
    auVar29 = pshuflw(auVar29,auVar29,0);
    local_b8._0_4_ = auVar29._0_4_;
    local_b8._4_4_ = local_b8._0_4_;
    local_b8._8_4_ = local_b8._0_4_;
    local_b8._12_4_ = local_b8._0_4_;
    local_d0 = *MVar23.p;
    __n = ((InternalMetadata *)((long)MVar23.p + 8))->ptr_;
    uVar27 = 0;
    local_158._32_8_ = local_108[0].heap.control;
    local_158._40_8_ = MVar23.p;
    _local_c8 = (DescriptorProto *)(uVar28 + lVar15);
    while( true ) {
      pDVar22 = (DescriptorProto *)(uVar24 & uVar6);
      puVar2 = (ulong *)((long)&(pDVar22->super_Message).super_MessageLite._vptr_MessageLite +
                        local_158._32_8_);
      cStack_a0 = (char)puVar2[1];
      cStack_9f = *(char *)((long)puVar2 + 9);
      cStack_9e = *(char *)((long)puVar2 + 10);
      cStack_9d = *(char *)((long)puVar2 + 0xb);
      cStack_9c = *(char *)((long)puVar2 + 0xc);
      cStack_9b = *(char *)((long)puVar2 + 0xd);
      cStack_9a = *(char *)((long)puVar2 + 0xe);
      cStack_99 = *(char *)((long)puVar2 + 0xf);
      auVar32[0] = -(local_b8[0] == (char)*puVar2);
      auVar32[1] = -(local_b8[1] == *(char *)((long)puVar2 + 1));
      auVar32[2] = -(local_b8[2] == *(char *)((long)puVar2 + 2));
      auVar32[3] = -(local_b8[3] == *(char *)((long)puVar2 + 3));
      auVar32[4] = -(local_b8[4] == *(char *)((long)puVar2 + 4));
      auVar32[5] = -(local_b8[5] == *(char *)((long)puVar2 + 5));
      auVar32[6] = -(local_b8[6] == *(char *)((long)puVar2 + 6));
      auVar32[7] = -(local_b8[7] == *(char *)((long)puVar2 + 7));
      auVar32[8] = -(local_b8[8] == cStack_a0);
      auVar32[9] = -(local_b8[9] == cStack_9f);
      auVar32[10] = -(local_b8[10] == cStack_9e);
      auVar32[0xb] = -(local_b8[0xb] == cStack_9d);
      auVar32[0xc] = -(local_b8[0xc] == cStack_9c);
      auVar32[0xd] = -(local_b8[0xd] == cStack_9b);
      auVar32[0xe] = -(local_b8[0xe] == cStack_9a);
      auVar32[0xf] = -(local_b8[0xf] == cStack_99);
      uVar10 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
      uVar20 = (uint)uVar10;
      pDVar8 = pDVar22;
      pDVar21 = (DescriptorProto *)local_158._48_8_;
      uVar28 = (MessageOptions *)*puVar2;
      while (local_158._48_8_ = pDVar8, _local_a8 = uVar28, uVar10 != 0) {
        uVar3 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar24 = (long)&(pDVar22->super_Message).super_MessageLite._vptr_MessageLite + (ulong)uVar3
                 & uVar6;
        if ((((InternalMetadata *)(uVar26 + 8))[uVar24 * 10].ptr_ == __n) &&
           ((__n == 0 ||
            (iVar11 = bcmp(*(void **)(uVar26 + uVar24 * 0x50),(void *)local_d0,__n),
            pDVar22 = (DescriptorProto *)local_158._48_8_, iVar11 == 0)))) {
          if ((DescriptorProto *)local_158._32_8_ == (DescriptorProto *)0x0) goto LAB_001f520a;
          pDVar22 = (DescriptorProto *)(local_158._32_8_ + uVar24);
          if (pDVar22 != (DescriptorProto *)local_e0) {
            if (*(char *)&(pDVar22->super_Message).super_MessageLite._vptr_MessageLite < '\0')
            goto LAB_001f51e6;
            uVar26 = uVar26 + uVar24 * 0x50;
            bVar17 = false;
            goto LAB_001f4eff;
          }
          pDVar22 = (DescriptorProto *)local_e0;
          if ((code *)_local_c8 == local_e0) goto LAB_001f509b;
          if (-1 < *(char *)_local_c8) goto LAB_001f524d;
          goto LAB_001f5292;
        }
        uVar10 = (ushort)(uVar20 - 1) & (ushort)uVar20;
        uVar20 = CONCAT22((short)(uVar20 - 1 >> 0x10),uVar10);
        pDVar8 = (DescriptorProto *)local_158._48_8_;
        pDVar21 = (DescriptorProto *)local_158._48_8_;
        uVar28 = _local_a8;
      }
      local_a8 = (undefined1)uVar28;
      uStack_a7 = (undefined1)((ulong)uVar28 >> 8);
      uStack_a6 = (undefined1)((ulong)uVar28 >> 0x10);
      uStack_a5 = (undefined1)((ulong)uVar28 >> 0x18);
      uStack_a4 = (undefined1)((ulong)uVar28 >> 0x20);
      uStack_a3 = (undefined1)((ulong)uVar28 >> 0x28);
      uStack_a2 = (undefined1)((ulong)uVar28 >> 0x30);
      uStack_a1 = (undefined1)((ulong)uVar28 >> 0x38);
      auVar33[0] = -(local_a8 == -0x80);
      auVar33[1] = -(uStack_a7 == -0x80);
      auVar33[2] = -(uStack_a6 == -0x80);
      auVar33[3] = -(uStack_a5 == -0x80);
      auVar33[4] = -(uStack_a4 == -0x80);
      auVar33[5] = -(uStack_a3 == -0x80);
      auVar33[6] = -(uStack_a2 == -0x80);
      auVar33[7] = -(uStack_a1 == -0x80);
      auVar33[8] = -(cStack_a0 == -0x80);
      auVar33[9] = -(cStack_9f == -0x80);
      auVar33[10] = -(cStack_9e == -0x80);
      auVar33[0xb] = -(cStack_9d == -0x80);
      auVar33[0xc] = -(cStack_9c == -0x80);
      auVar33[0xd] = -(cStack_9b == -0x80);
      auVar33[0xe] = -(cStack_9a == -0x80);
      auVar33[0xf] = -(cStack_99 == -0x80);
      local_158._48_8_ = pDVar21;
      if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar33 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar33 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar33 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar33 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_99 == -0x80)
      break;
      uVar24 = (long)&pDVar22->field_0 + uVar27;
      uVar27 = uVar27 + 0x10;
      if ((ulong)uVar6 < uVar27) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdbd,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                     );
      }
    }
    bVar17 = true;
    pDVar22 = (DescriptorProto *)0x0;
LAB_001f4eff:
    if ((code *)_local_c8 == local_e0) {
LAB_001f524d:
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"raw_hash_set.h",0x687,"Invalid iterator comparison. %s",
                 "Comparing default-constructed hashtable iterator with a non-default-constructed hashtable iterator."
                );
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x687,
                    "auto absl::container_internal::AssertSameContainer(const ctrl_t *, const ctrl_t *, const void *const &, const void *const &, const GenerationType *, const GenerationType *)::(anonymous class)::operator()(bool, const char *) const"
                   );
    }
    if (*(char *)_local_c8 < '\0') {
LAB_001f5292:
      CheckFieldJsonNameUniqueness();
LAB_001f5297:
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                   );
    }
    if (bVar17) goto LAB_001f509b;
    bVar17 = ((DescriptorProto *)_local_c8 ==
             (DescriptorProto *)&absl::lts_20240722::container_internal::kSooControl) !=
             (pDVar22 == (DescriptorProto *)&absl::lts_20240722::container_internal::kSooControl);
    uVar18 = CONCAT71((int7)((ulong)uVar18 >> 8),bVar17);
    if (!bVar17) {
      if (pDVar22 == (DescriptorProto *)&absl::lts_20240722::container_internal::kSooControl) {
        pDVar22 = (DescriptorProto *)&absl::lts_20240722::container_internal::kSooControl;
        if (uVar26 == local_158._40_8_) goto LAB_001f509b;
      }
      else {
        MVar23 = (MaybeInitializedPtr)local_158._40_8_;
        uVar18 = _local_c8;
        if ((ulong)_local_c8 < pDVar22) {
          MVar23 = (MaybeInitializedPtr)uVar26;
          uVar18 = pDVar22;
          uVar26 = local_158._40_8_;
        }
        if (((ulong)uVar18 < (ulong)uVar26) && ((ulong)uVar26 <= MVar23.p)) {
LAB_001f509b:
          uVar28 = local_d8;
          if (pDVar22 != (DescriptorProto *)_local_c8) {
            __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xf3f,
                          "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<google::protobuf::(anonymous namespace)::JsonNameDetails &>>]"
                         );
          }
LAB_001f50b1:
          if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
            operator_delete((void *)local_180._0_8_,(ulong)(local_170._M_allocated_capacity + 1));
          }
          uVar28 = &(((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)uVar28)->
                    super_RepeatedPtrFieldBase).current_size_;
          pDVar22 = (DescriptorProto *)uVar18;
          if ((void **)uVar28 == local_88) goto LAB_001f5167;
          goto LAB_001f48c0;
        }
      }
    }
    CheckFieldJsonNameUniqueness();
LAB_001f518b:
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"raw_hash_set.h",0x628,"%s called on default-constructed iterator.",
               "operator->");
    CheckFieldJsonNameUniqueness();
LAB_001f51bb:
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"raw_hash_set.h",0x63e,
               "%s called on invalid iterator. The element might have been erased or the table might have rehashed. Consider running with --config=asan to diagnose rehashing issues."
               ,"operator->");
    CheckFieldJsonNameUniqueness();
LAB_001f51e6:
    CheckFieldJsonNameUniqueness();
  }
LAB_001f51eb:
  __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x145,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

void DescriptorBuilder::CheckFieldJsonNameUniqueness(
    const absl::string_view message_name, const DescriptorProto& message,
    const Descriptor* descriptor, bool use_custom_names) {
  absl::flat_hash_map<std::string, JsonNameDetails> name_to_field;
  for (const FieldDescriptorProto& field : message.field()) {
    JsonNameDetails details = GetJsonNameDetails(&field, use_custom_names);
    if (details.is_custom && JsonNameLooksLikeExtension(details.orig_name)) {
      auto make_error = [&] {
        return absl::StrFormat(
            "The custom JSON name of field \"%s\" (\"%s\") is invalid: "
            "JSON names may not start with '[' and end with ']'.",
            field.name(), details.orig_name);
      };
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
      continue;
    }
    auto it_inserted = name_to_field.try_emplace(details.orig_name, details);
    if (it_inserted.second) {
      continue;
    }
    JsonNameDetails& match = it_inserted.first->second;
    if (use_custom_names && !details.is_custom && !match.is_custom) {
      // if this pass is considering custom JSON names, but neither of the
      // names involved in the conflict are custom, don't bother with a
      // message. That will have been reported from other pass (non-custom
      // JSON names).
      continue;
    }
    auto make_error = [&] {
      absl::string_view this_type = details.is_custom ? "custom" : "default";
      absl::string_view existing_type = match.is_custom ? "custom" : "default";
      // If the matched name differs (which it can only differ in case), include
      // it in the error message, for maximum clarity to user.
      std::string name_suffix = "";
      if (details.orig_name != match.orig_name) {
        name_suffix = absl::StrCat(" (\"", match.orig_name, "\")");
      }
      return absl::StrFormat(
          "The %s JSON name of field \"%s\" (\"%s\") conflicts "
          "with the %s JSON name of field \"%s\"%s.",
          this_type, field.name(), details.orig_name, existing_type,
          match.field->name(), name_suffix);
    };

    bool involves_default = !details.is_custom || !match.is_custom;
    if (descriptor->features().json_format() ==
            FeatureSet::LEGACY_BEST_EFFORT &&
        involves_default) {
      // TODO Upgrade this to an error once downstream protos
      // have been fixed.
      AddWarning(message_name, field, DescriptorPool::ErrorCollector::NAME,
                 make_error);
    } else {
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
    }
  }
}